

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O2

uc_err reg_read_mips64(void *_env,int mode,uint regid,void *value,size_t *size)

{
  uc_err uVar1;
  long lVar2;
  
  if (regid - 2 < 0x20) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    lVar2 = *(long *)((long)_env + (ulong)(regid - 2) * 8);
  }
  else {
    uVar1 = UC_ERR_ARG;
    switch(regid) {
    case 0x81:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      lVar2 = *(long *)((long)_env + 0x108);
      break;
    case 0x82:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      lVar2 = *(long *)((long)_env + 0x128);
      break;
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
      goto switchD_0078ea17_caseD_83;
    case 0x89:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      lVar2 = (long)*(int *)((long)_env + 0x6d4);
      break;
    case 0x8a:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      lVar2 = *(long *)((long)_env + 0x1a0);
      break;
    case 0x8b:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      lVar2 = (long)*(int *)((long)_env + 0x68c);
      break;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      lVar2 = *(long *)((long)_env + 0x100);
    }
  }
  *(long *)value = lVar2;
  uVar1 = UC_ERR_OK;
switchD_0078ea17_caseD_83:
  return uVar1;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUMIPSState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_MIPS_REG_0 && regid <= UC_MIPS_REG_31) {
        CHECK_REG_TYPE(mipsreg_t);
        *(mipsreg_t *)value = env->active_tc.gpr[regid - UC_MIPS_REG_0];
    } else {
        switch (regid) {
        default:
            break;
        case UC_MIPS_REG_HI:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.HI[0];
            break;
        case UC_MIPS_REG_LO:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.LO[0];
            break;
        case UC_MIPS_REG_PC:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.PC;
            break;
        case UC_MIPS_REG_CP0_CONFIG3:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->CP0_Config3;
            break;
        case UC_MIPS_REG_CP0_STATUS:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->CP0_Status;
            break;
        case UC_MIPS_REG_CP0_USERLOCAL:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.CP0_UserLocal;
            break;
        }
    }

    return ret;
}